

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-string.h
# Opt level: O0

String * __thiscall testing::internal::String::operator=(String *this,String *rhs)

{
  char *pcVar1;
  String *in_RSI;
  String *in_RDI;
  char *a_length;
  
  if (in_RDI != in_RSI) {
    a_length = in_RDI->c_str_;
    if (a_length != (char *)0x0) {
      operator_delete__(a_length);
    }
    pcVar1 = c_str(in_RSI);
    if (pcVar1 == (char *)0x0) {
      in_RDI->c_str_ = (char *)0x0;
      in_RDI->length_ = 0;
    }
    else {
      c_str(in_RSI);
      length(in_RSI);
      ConstructNonNull(in_RSI,(char *)in_RDI,(size_t)a_length);
    }
  }
  return in_RDI;
}

Assistant:

const String& operator=(const String& rhs) {
    if (this != &rhs) {
      delete[] c_str_;
      if (rhs.c_str() == NULL) {
        c_str_ = NULL;
        length_ = 0;
      } else {
        ConstructNonNull(rhs.c_str(), rhs.length());
      }
    }

    return *this;
  }